

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  LogMessage *pLVar7;
  long lVar8;
  char *pcVar9;
  char *end;
  int local_a8;
  uint32 unicode;
  int code_1;
  int code;
  char *ptr;
  size_t new_len;
  string local_88;
  LogMessage local_58;
  long local_20;
  size_t text_size;
  string *output_local;
  string *text_local;
  
  text_size = (size_t)output;
  output_local = text;
  lVar6 = std::__cxx11::string::size();
  local_20 = lVar6;
  if (lVar6 == 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x414);
    pLVar7 = internal::LogMessage::operator<<
                       (&local_58,
                        " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: "
                       );
    CEscape(&local_88,output_local);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_88);
    internal::LogFinisher::operator=((LogFinisher *)((long)&new_len + 7),pLVar7);
    std::__cxx11::string::~string((string *)&local_88);
    internal::LogMessage::~LogMessage(&local_58);
  }
  else {
    lVar8 = std::__cxx11::string::size();
    ptr = (char *)(lVar6 + lVar8);
    pcVar9 = (char *)std::__cxx11::string::capacity();
    if (pcVar9 < (char *)(lVar6 + lVar8)) {
      std::__cxx11::string::reserve(text_size);
    }
    pcVar9 = (char *)std::__cxx11::string::c_str();
    while (_code_1 = pcVar9 + 1, *_code_1 != '\0') {
      if ((*_code_1 == '\\') && (pcVar9[2] != '\0')) {
        _code_1 = pcVar9 + 2;
        bVar3 = anon_unknown_4::OctalDigit::InClass(*_code_1);
        sVar2 = text_size;
        if (bVar3) {
          unicode = anon_unknown_4::DigitValue(*_code_1);
          bVar3 = anon_unknown_4::OctalDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            iVar5 = unicode * 8;
            iVar4 = anon_unknown_4::DigitValue(*_code_1);
            unicode = iVar5 + iVar4;
          }
          bVar3 = anon_unknown_4::OctalDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            iVar5 = unicode * 8;
            iVar4 = anon_unknown_4::DigitValue(*_code_1);
            unicode = iVar5 + iVar4;
          }
          std::__cxx11::string::push_back((char)text_size);
          pcVar9 = _code_1;
        }
        else if (*_code_1 == 'x') {
          local_a8 = 0;
          bVar3 = anon_unknown_4::HexDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            local_a8 = anon_unknown_4::DigitValue(*_code_1);
          }
          bVar3 = anon_unknown_4::HexDigit::InClass(_code_1[1]);
          if (bVar3) {
            _code_1 = _code_1 + 1;
            iVar5 = local_a8 * 0x10;
            local_a8 = anon_unknown_4::DigitValue(*_code_1);
            local_a8 = iVar5 + local_a8;
          }
          std::__cxx11::string::push_back((char)text_size);
          pcVar9 = _code_1;
        }
        else if ((*_code_1 == 'u') || (*_code_1 == 'U')) {
          pcVar9 = FetchUnicodePoint(_code_1,(uint32 *)((long)&end + 4));
          if (pcVar9 == _code_1) {
            std::__cxx11::string::push_back((char)text_size);
            pcVar9 = _code_1;
          }
          else {
            AppendUTF8(end._4_4_,(string *)text_size);
            pcVar9 = pcVar9 + -1;
          }
        }
        else {
          anon_unknown_4::TranslateEscape(*_code_1);
          std::__cxx11::string::push_back((char)sVar2);
          pcVar9 = _code_1;
        }
      }
      else {
        cVar1 = *_code_1;
        pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)output_local);
        if ((cVar1 != *pcVar9) || (pcVar9 = _code_1, _code_1[1] != '\0')) {
          std::__cxx11::string::push_back((char)text_size);
          pcVar9 = _code_1;
        }
      }
    }
  }
  return;
}

Assistant:

void Tokenizer::ParseStringAppend(const string& text, string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    GOOGLE_LOG(DFATAL)
      << " Tokenizer::ParseStringAppend() passed text that could not"
         " have been tokenized as a string: " << CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32 unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}